

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rcu_list.hpp
# Opt level: O1

void __thiscall
gmlc::libguarded::
rcu_list<std::aligned_storage<256UL,_16UL>::type,_std::mutex,_MockAllocator<std::aligned_storage<256UL,_16UL>::type>_>
::emplace_back<>(rcu_list<std::aligned_storage<256UL,_16UL>::type,_std::mutex,_MockAllocator<std::aligned_storage<256UL,_16UL>::type>_>
                 *this)

{
  __pointer_type pnVar1;
  int iVar2;
  node *pnVar3;
  __pointer_type pnVar4;
  unique_ptr<gmlc::libguarded::rcu_list<std::aligned_storage<256UL,_16UL>::type,_std::mutex,_MockAllocator<std::aligned_storage<256UL,_16UL>::type>_>::node,_gmlc::libguarded::detail::deallocator<MockAllocator<gmlc::libguarded::rcu_list<std::aligned_storage<256UL,_16UL>::type,_std::mutex,_MockAllocator<std::aligned_storage<256UL,_16UL>::type>_>::node>_>_>
  local_28;
  
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)&this->m_write_mutex);
  if (iVar2 != 0) {
    std::__throw_system_error(iVar2);
  }
  pnVar3 = MockAllocator<gmlc::libguarded::rcu_list<std::aligned_storage<256UL,_16UL>::type,_std::mutex,_MockAllocator<std::aligned_storage<256UL,_16UL>::type>_>::node>
           ::allocate(&this->m_node_alloc,1);
  memset(&pnVar3->data,0,0x100);
  (pnVar3->next)._M_b._M_p = (__pointer_type)0x0;
  (pnVar3->back)._M_b._M_p = (__pointer_type)0x0;
  pnVar3->deleted = false;
  local_28._M_t.
  super___uniq_ptr_impl<gmlc::libguarded::rcu_list<std::aligned_storage<256UL,_16UL>::type,_std::mutex,_MockAllocator<std::aligned_storage<256UL,_16UL>::type>_>::node,_gmlc::libguarded::detail::deallocator<MockAllocator<gmlc::libguarded::rcu_list<std::aligned_storage<256UL,_16UL>::type,_std::mutex,_MockAllocator<std::aligned_storage<256UL,_16UL>::type>_>::node>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_gmlc::libguarded::rcu_list<std::aligned_storage<256UL,_16UL>::type,_std::mutex,_MockAllocator<std::aligned_storage<256UL,_16UL>::type>_>::node_*,_gmlc::libguarded::detail::deallocator<MockAllocator<gmlc::libguarded::rcu_list<std::aligned_storage<256UL,_16UL>::type,_std::mutex,_MockAllocator<std::aligned_storage<256UL,_16UL>::type>_>::node>_>_>
  .
  super__Tuple_impl<1UL,_gmlc::libguarded::detail::deallocator<MockAllocator<gmlc::libguarded::rcu_list<std::aligned_storage<256UL,_16UL>::type,_std::mutex,_MockAllocator<std::aligned_storage<256UL,_16UL>::type>_>::node>_>_>
  .
  super__Head_base<1UL,_gmlc::libguarded::detail::deallocator<MockAllocator<gmlc::libguarded::rcu_list<std::aligned_storage<256UL,_16UL>::type,_std::mutex,_MockAllocator<std::aligned_storage<256UL,_16UL>::type>_>::node>_>,_false>
  ._M_head_impl.alloc.log =
       (_Head_base<1UL,_gmlc::libguarded::detail::deallocator<MockAllocator<gmlc::libguarded::rcu_list<std::aligned_storage<256UL,_16UL>::type,_std::mutex,_MockAllocator<std::aligned_storage<256UL,_16UL>::type>_>::node>_>,_false>
        )(this->m_node_alloc).log;
  pnVar1 = (this->m_tail)._M_b._M_p;
  pnVar4 = (__pointer_type)this;
  if (pnVar1 != (__pointer_type)0x0) {
    LOCK();
    (pnVar3->back)._M_b._M_p = pnVar1;
    UNLOCK();
    pnVar4 = pnVar1;
  }
  LOCK();
  (pnVar4->next)._M_b._M_p = pnVar3;
  UNLOCK();
  local_28._M_t.
  super___uniq_ptr_impl<gmlc::libguarded::rcu_list<std::aligned_storage<256UL,_16UL>::type,_std::mutex,_MockAllocator<std::aligned_storage<256UL,_16UL>::type>_>::node,_gmlc::libguarded::detail::deallocator<MockAllocator<gmlc::libguarded::rcu_list<std::aligned_storage<256UL,_16UL>::type,_std::mutex,_MockAllocator<std::aligned_storage<256UL,_16UL>::type>_>::node>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_gmlc::libguarded::rcu_list<std::aligned_storage<256UL,_16UL>::type,_std::mutex,_MockAllocator<std::aligned_storage<256UL,_16UL>::type>_>::node_*,_gmlc::libguarded::detail::deallocator<MockAllocator<gmlc::libguarded::rcu_list<std::aligned_storage<256UL,_16UL>::type,_std::mutex,_MockAllocator<std::aligned_storage<256UL,_16UL>::type>_>::node>_>_>
  .
  super__Head_base<0UL,_gmlc::libguarded::rcu_list<std::aligned_storage<256UL,_16UL>::type,_std::mutex,_MockAllocator<std::aligned_storage<256UL,_16UL>::type>_>::node_*,_false>
  ._M_head_impl = (node *)0x0;
  LOCK();
  (this->m_tail)._M_b._M_p = pnVar3;
  UNLOCK();
  std::
  unique_ptr<gmlc::libguarded::rcu_list<std::aligned_storage<256UL,_16UL>::type,_std::mutex,_MockAllocator<std::aligned_storage<256UL,_16UL>::type>_>::node,_gmlc::libguarded::detail::deallocator<MockAllocator<gmlc::libguarded::rcu_list<std::aligned_storage<256UL,_16UL>::type,_std::mutex,_MockAllocator<std::aligned_storage<256UL,_16UL>::type>_>::node>_>_>
  ::~unique_ptr(&local_28);
  pthread_mutex_unlock((pthread_mutex_t *)&this->m_write_mutex);
  return;
}

Assistant:

void rcu_list<T, M, Alloc>::emplace_back(Us&&... vs)
{
    std::lock_guard<M> guard(m_write_mutex);
    auto newNode =
        detail::allocate_unique<node>(m_node_alloc, std::forward<Us>(vs)...);

    node* oldTail = m_tail.load(std::memory_order_relaxed);

    if (oldTail == nullptr) {
        m_head.store(newNode.get());
        m_tail.store(newNode.release());
    } else {
        newNode->back.store(oldTail);
        oldTail->next.store(newNode.get());
        m_tail.store(newNode.release());
    }
}